

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MixSegment.hpp
# Opt level: O2

void __thiscall
cppjieba::MixSegment::Cut
          (MixSegment *this,string *sentence,
          vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *words,bool hmm)

{
  Range RVar1;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> wrs;
  PreFilter pre_filter;
  _Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> local_1b8;
  PreFilter local_198;
  
  PreFilter::PreFilter(&local_198,&(this->super_SegmentTagged).super_SegmentBase.symbols_,sentence);
  local_1b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::reserve
            ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)&local_1b8,
             sentence->_M_string_length >> 1);
  while (local_198.cursor_ != local_198.sentence_.ptr_ + local_198.sentence_.size_) {
    RVar1 = PreFilter::Next(&local_198);
    Cut(this,RVar1.begin,RVar1.end,
        (vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)&local_1b8,hmm);
  }
  std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::clear(words);
  std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::reserve
            (words,(long)local_1b8._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_1b8._M_impl.super__Vector_impl_data._M_start >> 4);
  GetWordsFromWordRanges
            (sentence,(vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)
                      &local_1b8,words);
  std::_Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::~_Vector_base
            (&local_1b8);
  limonp::LocalVector<cppjieba::RuneStr>::~LocalVector(&local_198.sentence_);
  return;
}

Assistant:

void Cut(const string& sentence, vector<Word>& words, bool hmm = true) const {
    PreFilter pre_filter(symbols_, sentence);
    PreFilter::Range range;
    vector<WordRange> wrs;
    wrs.reserve(sentence.size() / 2);
    while (pre_filter.HasNext()) {
      range = pre_filter.Next();
      Cut(range.begin, range.end, wrs, hmm);
    }
    words.clear();
    words.reserve(wrs.size());
    GetWordsFromWordRanges(sentence, wrs, words);
  }